

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvsFoodWeb_ASAi_kry.c
# Opt level: O0

void InitUserData(WebData wdata)

{
  long lVar1;
  long lVar2;
  long in_RDI;
  double dVar3;
  sunrealtype (*acoef) [6];
  sunrealtype dy;
  sunrealtype dx;
  sunrealtype *coy;
  sunrealtype *cox;
  sunrealtype *diff;
  sunrealtype *bcoef;
  int ns;
  int j;
  int i;
  undefined4 local_10;
  undefined4 local_c;
  
  lVar1 = in_RDI + 0x130;
  lVar2 = in_RDI + 0x280;
  *(undefined4 *)(in_RDI + 0x40) = 6;
  for (local_10 = 0; local_10 < 6; local_10 = local_10 + 1) {
    for (local_c = 0; local_c < 6; local_c = local_c + 1) {
      *(undefined8 *)(lVar1 + (long)local_c * 0x30 + (long)local_10 * 8) = 0;
    }
  }
  for (local_10 = 0; local_10 < 3; local_10 = local_10 + 1) {
    for (local_c = 0; local_c < 3; local_c = local_c + 1) {
      *(undefined8 *)(lVar1 + (long)(local_c + 3) * 0x30 + (long)local_10 * 8) = 0x40c3880000000000;
      *(undefined8 *)(lVar1 + (long)local_c * 0x30 + (long)(local_10 + 3) * 8) = 0xbea0c6f7a0b5ed8d;
    }
    *(undefined8 *)(lVar1 + (long)local_10 * 0x30 + (long)local_10 * 8) = 0xbff0000000000000;
    *(undefined8 *)(lVar1 + (long)(local_10 + 3) * 0x30 + (long)(local_10 + 3) * 8) =
         0xbff0000000000000;
    *(undefined8 *)(in_RDI + 0x250 + (long)local_10 * 8) = 0x3ff0000000000000;
    *(undefined8 *)(in_RDI + 0x250 + (long)(local_10 + 3) * 8) = 0xbff0000000000000;
    *(undefined8 *)(lVar2 + (long)local_10 * 8) = 0x3ff0000000000000;
    *(undefined8 *)(lVar2 + (long)(local_10 + 3) * 8) = 0x3fe0000000000000;
  }
  *(undefined4 *)(in_RDI + 0x44) = 0x78;
  *(undefined8 *)(in_RDI + 0x310) = 0x3faaf286bca1af28;
  *(undefined8 *)(in_RDI + 0x318) = 0x3faaf286bca1af28;
  for (local_c = 0; local_c < 6; local_c = local_c + 1) {
    *(double *)(in_RDI + 0x2b0 + (long)local_c * 8) =
         *(double *)(lVar2 + (long)local_c * 8) / 0.0027700831024930744;
    *(double *)(in_RDI + 0x2e0 + (long)local_c * 8) =
         *(double *)(lVar2 + (long)local_c * 8) / 0.0027700831024930744;
  }
  *(undefined4 *)(in_RDI + 0x48) = 6;
  *(undefined4 *)(in_RDI + 0x4c) = 400;
  *(undefined4 *)(in_RDI + 0x50) = 0x14;
  *(undefined4 *)(in_RDI + 0x54) = 0x14;
  dVar3 = sqrt(2.220446049250313e-16);
  *(double *)(in_RDI + 800) = dVar3;
  *(undefined4 *)(in_RDI + 100) = 0x78;
  *(undefined4 *)(in_RDI + 0x58) = 4;
  *(undefined4 *)(in_RDI + 0x5c) = 2;
  *(undefined4 *)(in_RDI + 0x60) = 2;
  SetGroups(0x14,2,(int *)(in_RDI + 0x68),(int *)(in_RDI + 0x80),(int *)(in_RDI + 0x120));
  SetGroups(0x14,2,(int *)(in_RDI + 0x74),(int *)(in_RDI + 0xd0),(int *)(in_RDI + 0x128));
  return;
}

Assistant:

static void InitUserData(WebData wdata)
{
  int i, j, ns;
  sunrealtype *bcoef, *diff, *cox, *coy, dx, dy;
  sunrealtype(*acoef)[NS];

  acoef = wdata->acoef;
  bcoef = wdata->bcoef;
  diff  = wdata->diff;
  cox   = wdata->cox;
  coy   = wdata->coy;
  ns = wdata->ns = NS;

  for (j = 0; j < NS; j++)
  {
    for (i = 0; i < NS; i++) { acoef[i][j] = ZERO; }
  }
  for (j = 0; j < NP; j++)
  {
    for (i = 0; i < NP; i++)
    {
      acoef[NP + i][j] = EE;
      acoef[i][NP + j] = -GG;
    }
    acoef[j][j]           = -AA;
    acoef[NP + j][NP + j] = -AA;
    bcoef[j]              = BB;
    bcoef[NP + j]         = -BB;
    diff[j]               = DPREY;
    diff[NP + j]          = DPRED;
  }

  /* Set remaining problem parameters */

  wdata->mxns = MXNS;
  dx = wdata->dx = DX;
  dy = wdata->dy = DY;
  for (i = 0; i < ns; i++)
  {
    cox[i] = diff[i] / SQR(dx);
    coy[i] = diff[i] / SQR(dy);
  }

  /* Set remaining method parameters */

  wdata->mp   = MP;
  wdata->mq   = MQ;
  wdata->mx   = MX;
  wdata->my   = MY;
  wdata->srur = sqrt(SUN_UNIT_ROUNDOFF);
  wdata->mxmp = MXMP;
  wdata->ngrp = NGRP;
  wdata->ngx  = NGX;
  wdata->ngy  = NGY;
  SetGroups(MX, NGX, wdata->jgx, wdata->jigx, wdata->jxr);
  SetGroups(MY, NGY, wdata->jgy, wdata->jigy, wdata->jyr);
}